

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

int * __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::choose_data
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this,size_t desired_capacity)

{
  int *piVar1;
  type *ptVar2;
  ulong __n;
  
  ptVar2 = (type *)this->m_dynamic_data;
  if ((type *)this->m_begin == ptVar2) {
    if (this->m_dynamic_capacity < desired_capacity) {
      __n = this->m_dynamic_capacity;
      if (__n < desired_capacity) {
        do {
          __n = __n * 3 + 1 >> 1;
        } while (__n < desired_capacity);
        this->m_dynamic_capacity = __n;
      }
      ptVar2 = (type *)__gnu_cxx::new_allocator<int>::allocate
                                 ((new_allocator<int> *)this,__n,(void *)0x0);
      this->m_dynamic_data = (pointer)ptVar2;
    }
  }
  else if (desired_capacity < 5) {
    ptVar2 = this->m_static_data;
  }
  else {
    if (this->m_dynamic_capacity < desired_capacity) {
      if (ptVar2 != (type *)0x0) {
        operator_delete(ptVar2,this->m_dynamic_capacity << 2);
      }
      this->m_dynamic_capacity = desired_capacity;
      piVar1 = __gnu_cxx::new_allocator<int>::allocate
                         ((new_allocator<int> *)this,desired_capacity,(void *)0x0);
      this->m_dynamic_data = piVar1;
    }
    ptVar2 = (type *)this->m_dynamic_data;
  }
  return (int *)ptVar2;
}

Assistant:

T* choose_data(size_t desired_capacity)
    {
        if (m_begin == m_dynamic_data)
        {
            // we're at the dyn buffer, so see if it needs resize or revert to static

            if (desired_capacity > m_dynamic_capacity)
            {
                while (m_dynamic_capacity < desired_capacity)
                {
                    // grow by roughly 1.5
                    m_dynamic_capacity *= 3;
                    ++m_dynamic_capacity;
                    m_dynamic_capacity /= 2;
                }

                m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
                return m_dynamic_data;
            }
            else if (desired_capacity < RevertToStaticSize)
            {
                // we're reverting to the static buffer
                return static_begin_ptr();
            }
            else
            {
                // if the capacity and we don't revert to static, just do nothing
                return m_dynamic_data;
            }
        }
        else
        {
            assert(m_begin == static_begin_ptr()); // corrupt begin ptr?

            if (desired_capacity > StaticCapacity)
            {
                // we must move to dyn memory

                // see if we have enough
                if (desired_capacity > m_dynamic_capacity)
                {
                    // we need to allocate more
                    // we don't have anything to destroy, so we can also deallocate the buffer
                    if (m_dynamic_data)
                    {
                        atraits::deallocate(get_alloc(), m_dynamic_data, m_dynamic_capacity);
                    }

                    m_dynamic_capacity = desired_capacity;
                    m_dynamic_data = atraits::allocate(get_alloc(), m_dynamic_capacity);
                }

                return m_dynamic_data;
            }
            else
            {
                // we have enough capacity as it is
                return static_begin_ptr();
            }
        }
    }